

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::HttpSocket::_ParseHeader(HttpSocket *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *hdrend;
  char *hptr;
  HttpSocket *this_local;
  
  std::__cxx11::string::operator+=((string *)&this->_tmpHdr,(this->super_TcpSocket)._inbuf);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  if (((((this->super_TcpSocket)._recvSize < 5) && (uVar4 = std::__cxx11::string::size(), uVar4 < 5)
       ) || (iVar1 = memcmp("HTTP/",pcVar3,5), iVar1 == 0)) &&
     ((pcVar5 = strstr(pcVar3,"\r\n\r\n"), pcVar5 != (char *)0x0 &&
      (pcVar3 = strchr(pcVar3 + 5,0x20), pcVar3 != (char *)0x0)))) {
    uVar2 = atoi(pcVar3 + 1);
    this->_status = uVar2;
    this->_chunkedTransfer = false;
    this->_contentLen = 0;
    pcVar3 = strstr(pcVar3 + 1,"\r\n");
    _ParseHeaderFields(this,pcVar3 + 2,(long)pcVar5 - (long)pcVar3);
    _HandleStatus(this);
    pcVar3 = strstr((this->super_TcpSocket)._inbuf,"\r\n\r\n");
    (this->super_TcpSocket)._readptr = pcVar3 + 4;
    (this->super_TcpSocket)._recvSize =
         (this->super_TcpSocket)._recvSize -
         ((int)(this->super_TcpSocket)._readptr - (int)(this->super_TcpSocket)._inbuf);
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void HttpSocket::_ParseHeader(void)
{
    _tmpHdr += _inbuf;
    const char *hptr = _tmpHdr.c_str();

    if((_recvSize >= 5 || _tmpHdr.size() >= 5) && memcmp("HTTP/", hptr, 5))
    {
        traceprint("_ParseHeader: not HTTP stream\n");
        return;
    }

    const char *hdrend = strstr(hptr, "\r\n\r\n");
    if(!hdrend)
    {
        traceprint("_ParseHeader: could not find end-of-header marker, or incomplete buf; delaying.\n");
        return;
    }

    //traceprint(hptr);

    hptr = strchr(hptr + 5, ' '); // skip "HTTP/", already known
    if(!hptr)
        return; // WTF?
    ++hptr; // number behind first space is the status code
    _status = atoi(hptr);

    // Default values
    _chunkedTransfer = false;
    _contentLen = 0; // yet unknown

    hptr = strstr(hptr, "\r\n");
    _ParseHeaderFields(hptr + 2, hdrend - hptr);

    // FIXME: return value indicates success.
    // Bail out on non-success, or at least make it so that _OnRecv() is not called.
    // (Unless an override bool is given that even non-successful answers get their data delivered!)
    _HandleStatus();

    // get ready
    _readptr = strstr(_inbuf, "\r\n\r\n") + 4; // skip double newline. must have been found in hptr earlier.
    _recvSize -= (_readptr - _inbuf); // skip the header part
    _tmpHdr.clear();
}